

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KBO.cpp
# Opt level: O2

Result __thiscall Kernel::KBO::compare(KBO *this,AppliedTerm tl1,AppliedTerm tl2)

{
  State *this_00;
  AppliedTerm tl1_00;
  AppliedTerm tl1_01;
  AppliedTerm tl2_00;
  AppliedTerm tl2_01;
  TermList TVar1;
  TermList TVar2;
  bool bVar3;
  Result RVar4;
  EVP_PKEY_CTX *in_RSI;
  
  bVar3 = AppliedTerm::equalsShallow(&tl1,tl2);
  TVar2 = tl2.term;
  TVar1 = tl1.term;
  if (bVar3) {
    RVar4 = EQUAL;
  }
  else if ((tl1.term._content & 1) == 0) {
    if ((tl2.term._content & 1) == 0) {
      this_00 = (this->_state)._M_t.
                super___uniq_ptr_impl<Kernel::KBO::State,_std::default_delete<Kernel::KBO::State>_>.
                _M_t.
                super__Tuple_impl<0UL,_Kernel::KBO::State_*,_std::default_delete<Kernel::KBO::State>_>
                .super__Head_base<0UL,_Kernel::KBO::State_*,_false>._M_head_impl;
      State::init(this_00,in_RSI);
      if (*(int *)(TVar1._content + 8) == *(int *)(TVar2._content + 8)) {
        tl1_00.aboveVar = tl1.aboveVar;
        tl1_00._9_7_ = tl1._9_7_;
        tl1_00.term._content = tl1.term._content;
        tl1_00.applicator = tl1.applicator;
        tl2_00.aboveVar = tl2.aboveVar;
        tl2_00._9_7_ = tl2._9_7_;
        tl2_00.term._content = tl2.term._content;
        tl2_00.applicator = tl2.applicator;
        RVar4 = State::traverseLexBidir(this_00,this,tl1_00,tl2_00);
      }
      else {
        tl1_01.aboveVar = tl1.aboveVar;
        tl1_01._9_7_ = tl1._9_7_;
        tl1_01.term._content = tl1.term._content;
        tl1_01.applicator = tl1.applicator;
        tl2_01.aboveVar = tl2.aboveVar;
        tl2_01._9_7_ = tl2._9_7_;
        tl2_01.term._content = tl2.term._content;
        tl2_01.applicator = tl2.applicator;
        RVar4 = State::traverseNonLex<false>(this_00,this,tl1_01,tl2_01);
      }
    }
    else {
      bVar3 = AppliedTerm::containsVar(&tl1,tl2.term);
      RVar4 = (uint)!bVar3 + (uint)!bVar3 * 2 + GREATER;
    }
  }
  else {
    bVar3 = AppliedTerm::containsVar(&tl2,tl1.term);
    RVar4 = (uint)!bVar3 * 2 + LESS;
  }
  return RVar4;
}

Assistant:

Ordering::Result KBO::compare(AppliedTerm tl1, AppliedTerm tl2) const
{
  if(tl1.equalsShallow(tl2)) {
    return EQUAL;
  }
  if(tl1.term.isVar()) {
    return tl2.containsVar(tl1.term) ? LESS : INCOMPARABLE;
  }
  if(tl2.term.isVar()) {
    return tl1.containsVar(tl2.term) ? GREATER : INCOMPARABLE;
  }

  ASS(tl1.term.isTerm());
  ASS(tl2.term.isTerm());

  Term* t1=tl1.term.term();
  Term* t2=tl2.term.term();

  ASS(_state);
  State* state = _state.get();
#if VDEBUG
  //this is to make sure _state isn't used while we're using it
  auto __state = std::move(_state);
#endif

  state->init();
  Result res;
  if(t1->functor()==t2->functor()) {
    res = state->traverseLexBidir(*this, tl1, tl2);
  } else {
    res = state->traverseNonLex</*unidirectional=*/false>(*this, tl1, tl2);
  }
#if VDEBUG
  _state = std::move(__state);
#endif
  return res;
}